

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_strtype.cc
# Opt level: O0

void __thiscall
StringType::GenStringMismatch
          (StringType *this,Output *out_cc,Env *env,DataPtr *data,string *pattern)

{
  char *pcVar1;
  char *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Output *in_RSI;
  string tmp;
  ID *in_stack_ffffffffffffffa0;
  Env *in_stack_ffffffffffffffa8;
  string local_48 [56];
  Output *local_10;
  
  local_10 = in_RSI;
  pcVar1 = DataPtr::ptr_expr((DataPtr *)0x14bb0f);
  pcVar2 = Env::RValue(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  strfmt_abi_cxx11_((char *)local_48,"string((const char *) (%s), (const char *) %s).c_str()",pcVar1
                    ,pcVar2);
  pcVar1 = Object::Location((Object *)0x14bb5b);
  uVar3 = std::__cxx11::string::c_str();
  uVar4 = std::__cxx11::string::c_str();
  Output::println(local_10,"throw binpac::ExceptionStringMismatch(\"%s\", %s, %s);",pcVar1,uVar3,
                  uVar4);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void StringType::GenStringMismatch(Output* out_cc, Env* env, const DataPtr& data, string pattern)
	{
	string tmp = strfmt("string((const char *) (%s), (const char *) %s).c_str()", data.ptr_expr(),
	                    env->RValue(end_of_data));
	out_cc->println("throw binpac::ExceptionStringMismatch(\"%s\", %s, %s);", Location(),
	                pattern.c_str(), tmp.c_str());
	}